

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateSnapshot.cxx
# Opt level: O0

void __thiscall cmStateSnapshot::InitializeFromParent_ForSubdirsCommand(cmStateSnapshot *this)

{
  string *psVar1;
  allocator<char> local_149;
  string local_148;
  allocator<char> local_121;
  string local_120;
  allocator<char> local_f9;
  string local_f8;
  allocator<char> local_d1;
  string local_d0;
  allocator<char> local_a9;
  string local_a8;
  undefined1 local_88 [8];
  string currentBinDir;
  allocator<char> local_51;
  string local_50;
  undefined1 local_30 [8];
  string currentSrcDir;
  cmStateSnapshot *this_local;
  
  currentSrcDir.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"CMAKE_CURRENT_SOURCE_DIR",&local_51);
  psVar1 = GetDefinition(this,&local_50);
  std::__cxx11::string::string((string *)local_30,(string *)psVar1);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"CMAKE_CURRENT_BINARY_DIR",&local_a9);
  psVar1 = GetDefinition(this,&local_a8);
  std::__cxx11::string::string((string *)local_88,(string *)psVar1);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  InitializeFromParent(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"CMAKE_SOURCE_DIR",&local_d1);
  psVar1 = cmState::GetSourceDirectory_abi_cxx11_(this->State);
  SetDefinition(this,&local_d0,psVar1);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator(&local_d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"CMAKE_BINARY_DIR",&local_f9);
  psVar1 = cmState::GetBinaryDirectory_abi_cxx11_(this->State);
  SetDefinition(this,&local_f8,psVar1);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator(&local_f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120,"CMAKE_CURRENT_SOURCE_DIR",&local_121);
  SetDefinition(this,&local_120,(string *)local_30);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator(&local_121);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"CMAKE_CURRENT_BINARY_DIR",&local_149);
  SetDefinition(this,&local_148,(string *)local_88);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator(&local_149);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void cmStateSnapshot::InitializeFromParent_ForSubdirsCommand()
{
  std::string currentSrcDir = *this->GetDefinition("CMAKE_CURRENT_SOURCE_DIR");
  std::string currentBinDir = *this->GetDefinition("CMAKE_CURRENT_BINARY_DIR");
  this->InitializeFromParent();
  this->SetDefinition("CMAKE_SOURCE_DIR", this->State->GetSourceDirectory());
  this->SetDefinition("CMAKE_BINARY_DIR", this->State->GetBinaryDirectory());

  this->SetDefinition("CMAKE_CURRENT_SOURCE_DIR", currentSrcDir);
  this->SetDefinition("CMAKE_CURRENT_BINARY_DIR", currentBinDir);
}